

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SuiteSparse_config.c
# Opt level: O3

c_float SuiteSparse_hypot(c_float x,c_float y)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  
  dVar1 = ABS(x);
  dVar2 = ABS(y);
  dVar3 = dVar2 + dVar1;
  if (dVar2 <= dVar1) {
    if ((dVar3 != dVar1) || (dVar4 = dVar1, NAN(dVar3) || NAN(dVar1))) {
      dVar4 = SQRT((dVar2 / dVar1) * (dVar2 / dVar1) + 1.0) * dVar1;
    }
  }
  else if ((dVar3 != dVar2) || (dVar4 = dVar2, NAN(dVar3) || NAN(dVar2))) {
    dVar4 = SQRT((dVar1 / dVar2) * (dVar1 / dVar2) + 1.0) * dVar2;
  }
  return dVar4;
}

Assistant:

c_float SuiteSparse_hypot (c_float x, c_float y)
{
    c_float s, r ;
    x = fabs (x) ;
    y = fabs (y) ;
    if (x >= y)
    {
        if (x + y == x)
        {
            s = x ;
        }
        else
        {
            r = y / x ;
            s = x * sqrt (1.0 + r*r) ;
        }
    }
    else
    {
        if (y + x == y)
        {
            s = y ;
        }
        else
        {
            r = x / y ;
            s = y * sqrt (1.0 + r*r) ;
        }
    }
    return (s) ;
}